

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

double __thiscall UnitBoundedPolynomial1<3U>::interpolate(UnitBoundedPolynomial1<3U> *this,double t)

{
  int k;
  double tt;
  double y;
  double t_local;
  UnitBoundedPolynomial1<3U> *this_local;
  
  y = 0.0;
  tt = 1.0;
  for (k = 0; (uint)k < 4; k = k + 1) {
    y = this->coeffs[k] * tt + y;
    tt = t * tt;
  }
  return y;
}

Assistant:

double UnitBoundedPolynomial1<Order>::interpolate(double t) const
{
    double y = 0.0, tt = 1;

    for (int k = 0; k <= Order; ++k)
    {
        y += coeffs[k] * tt;
        tt *= t;
    }

    return y;
}